

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

void __thiscall cppforth::Forth::order(Forth *this)

{
  pointer piVar1;
  ostream *poVar2;
  pointer piVar3;
  
  piVar1 = (this->searchOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar3 = (this->searchOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar3 != piVar1) {
    do {
      if (this->writeToTarget == ToStdCout) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"wid",3);
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,piVar3[-1]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
        std::ostream::flush();
      }
      else if (this->writeToTarget == ToString) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->field_0x20,"wid",3);
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)&this->field_0x20,piVar3[-1]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      }
      piVar3 = piVar3 + -1;
    } while (piVar3 != piVar1);
  }
  if (this->writeToTarget != ToString) {
    if (this->writeToTarget == ToStdCout) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"wid",3);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,this->searchOrderCurrent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      std::ostream::flush();
      return;
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->field_0x20,"wid",3);
  poVar2 = (ostream *)
           std::ostream::operator<<((ostream *)&this->field_0x20,this->searchOrderCurrent);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  return;
}

Assistant:

void order(){
			for(auto it=searchOrder.rbegin(),itEnd=searchOrder.rend();it!=itEnd;++it){
#ifndef FORTHSCRIPTCPP_DISABLE_OUTPUT
				
				switch (writeToTarget) {
				case ToString:
					std_cout << "wid" << (*it)<< " ";
					break;
				case ToStdCout:
					std::cout << "wid" << (*it)<< " ";;
					std::cout.flush();
					break;
				default:
					break;
				}
#endif
			}					
#ifndef FORTHSCRIPTCPP_DISABLE_OUTPUT			
			switch (writeToTarget) {
			case ToString:
				std_cout << "wid" << searchOrderCurrent << " ";
				break;
			case ToStdCout:
				std::cout << "wid" << searchOrderCurrent << " ";;
				std::cout.flush();
				break;
			default:
				break;
			}
#endif
		}